

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.h
# Opt level: O0

TPZCompEl * __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::ReferredElement
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this,int64_t mesh)

{
  TPZCompElSide *this_00;
  TPZCompEl *pTVar1;
  int64_t in_RSI;
  long in_RDI;
  
  this_00 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0x78),in_RSI);
  pTVar1 = TPZCompElSide::Element(this_00);
  return pTVar1;
}

Assistant:

virtual TPZCompEl *ReferredElement(int64_t mesh) override
	{
		
#ifdef PZDEBUG
		if (fElementVec.size() <= mesh) {
			PZError << "Error at " << __PRETTY_FUNCTION__ << " index does not exist!\n";
			DebugStop();
		};
#endif
		
		return fElementVec[mesh].Element();
	}